

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::copy_from(sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *this,sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *ht,size_type min_buckets_wanted)

{
  bool bVar1;
  sparsetable<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
  *i;
  sparsetable<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
  *psVar2;
  size_type sVar3;
  result_type this_00;
  ulong uVar4;
  sparsetable<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  size_type bucket_count_minus_one;
  size_type bucknum;
  size_type num_probes;
  const_iterator it;
  size_type resize_to;
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff08;
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  size_type i_00;
  size_type in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  long lVar5;
  sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
  *in_stack_ffffffffffffff50;
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffd8;
  sparsetable<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
  *this_01;
  
  clear(in_stack_ffffffffffffff10);
  size(in_stack_ffffffffffffff10);
  i = (sparsetable<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)sparsehash_internal::
         sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>::
         min_buckets(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  this_01 = i;
  psVar2 = (sparsetable<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
            *)bucket_count((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)0xb7eff2);
  if (psVar2 < i) {
    sparsetable<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
    ::resize(this_01,in_stack_ffffffffffffffd8);
    bucket_count((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)0xb7f01f);
    sparsehash_internal::
    sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>::
    reset_thresholds((sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                      *)in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
  }
  begin(in_stack_ffffffffffffffa0);
  while( true ) {
    end(in_stack_ffffffffffffffa0);
    bVar1 = sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ::operator!=((sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                          *)in_stack_ffffffffffffff10,(const_iterator *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    lVar5 = 0;
    sVar3 = bucket_count((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                          *)0xb7f081);
    sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xb7f097);
    this_00 = get_key(in_stack_ffffffffffffff08,(const_reference)0xb7f0a4);
    uVar4 = sparse_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
            ::hash<std::pair<int,int>>
                      (in_stack_ffffffffffffff10,(pair<int,_int> *)in_stack_ffffffffffffff08);
    i_00 = in_stack_ffffffffffffff18;
    while( true ) {
      in_stack_ffffffffffffff18 = uVar4 & sVar3 - 1;
      bVar1 = sparsetable<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
              ::test(in_RDI,i_00);
      if (!bVar1) break;
      lVar5 = lVar5 + 1;
      uVar4 = in_stack_ffffffffffffff18 + lVar5;
    }
    in_stack_ffffffffffffff10 =
         (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)&in_RDI[1].groups.
             super__Vector_base<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             ._M_impl.super__Tp_alloc_type.count_;
    sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xb7f124);
    sparsetable<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
    ::set((sparsetable<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
           *)this_00,(size_type)i,(const_reference)in_RDI);
    sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator++((sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)in_stack_ffffffffffffff10);
  }
  sparsehash_internal::
  sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>::inc_num_ht_copies
            ((sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4> *)
             in_RDI);
  return;
}

Assistant:

void copy_from(const sparse_hashtable& ht, size_type min_buckets_wanted) {
    clear();  // clear table, set num_deleted to 0

    // If we need to change the size of our table, do it now
    const size_type resize_to =
        settings.min_buckets(ht.size(), min_buckets_wanted);
    if (resize_to > bucket_count()) {  // we don't have enough buckets
      table.resize(resize_to);         // sets the number of buckets
      settings.reset_thresholds(bucket_count());
    }

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    for (const_iterator it = ht.begin(); it != ht.end(); ++it) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(*it)) & bucket_count_minus_one;
           table.test(bucknum);  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }
      table.set(bucknum, *it);  // copies the value to here
    }
    settings.inc_num_ht_copies();
  }